

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPConnection.cpp
# Opt level: O0

DataBuffer * __thiscall TCPConnection::GetTxBuffer(TCPConnection *this)

{
  DataBuffer *pDVar1;
  size_t sVar2;
  DataBuffer *rc;
  TCPConnection *this_local;
  
  pDVar1 = ProtocolIPv4::GetTxBuffer(this->IP,this->MAC);
  if (pDVar1 != (DataBuffer *)0x0) {
    sVar2 = ProtocolTCP::header_size();
    pDVar1->Packet = pDVar1->Packet + sVar2;
    sVar2 = ProtocolTCP::header_size();
    pDVar1->Remainder = pDVar1->Remainder - (short)sVar2;
  }
  return pDVar1;
}

Assistant:

DataBuffer* TCPConnection::GetTxBuffer()
{
    DataBuffer* rc;

    rc = IP->GetTxBuffer(MAC);
    if (rc)
    {
        rc->Packet += ProtocolTCP::header_size();
        rc->Remainder -= ProtocolTCP::header_size();
    }

    return rc;
}